

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts5MergeChunkCallback(Fts5Index *p,void *pCtx,u8 *pChunk,int nChunk)

{
  int *pRc;
  int iVar1;
  byte bVar2;
  int iVar3;
  u32 nData;
  ulong uVar4;
  i64 dummy;
  u64 local_38;
  
  pRc = &p->rc;
  while (*pRc == 0) {
    iVar3 = *(int *)((long)pCtx + 0x28) + *(int *)((long)pCtx + 0x18);
    iVar1 = p->pConfig->pgsz;
    if (iVar3 + nChunk < iVar1) break;
    uVar4 = 0;
    while( true ) {
      nData = (u32)uVar4;
      if (iVar1 - iVar3 <= (int)nData) break;
      bVar2 = sqlite3Fts5GetVarint(pChunk + uVar4,&local_38);
      uVar4 = (ulong)(nData + bVar2);
    }
    sqlite3Fts5BufferAppendBlob(pRc,(Fts5Buffer *)((long)pCtx + 0x10),nData,pChunk);
    nChunk = nChunk - nData;
    fts5WriteFlushLeaf(p,(Fts5SegWriter *)pCtx);
    pChunk = pChunk + uVar4;
  }
  if (0 < nChunk) {
    sqlite3Fts5BufferAppendBlob(pRc,(Fts5Buffer *)((long)pCtx + 0x10),nChunk,pChunk);
    return;
  }
  return;
}

Assistant:

static void fts5MergeChunkCallback(
  Fts5Index *p, 
  void *pCtx, 
  const u8 *pChunk, int nChunk
){
  Fts5SegWriter *pWriter = (Fts5SegWriter*)pCtx;
  fts5WriteAppendPoslistData(p, pWriter, pChunk, nChunk);
}